

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O1

void libcellml::findAndReplaceComponentCnUnitsNames
               (ComponentPtr *component,string *oldName,string *newName)

{
  bool bVar1;
  int iVar2;
  pointer psVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  XmlNodePtr rootNode;
  string newMath;
  string originalMath;
  string newMathContent;
  vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
  mathDocs;
  string mathContent;
  XmlNodePtr local_f0;
  string local_e0;
  string local_c0;
  string local_a0;
  ComponentPtr *local_80;
  string *local_78;
  string *local_70;
  vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
  local_68;
  string local_50;
  
  local_78 = oldName;
  local_70 = newName;
  Component::math_abi_cxx11_
            (&local_50,
             (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
  if (local_50._M_string_length != 0) {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    multiRootXml(&local_68,&local_50);
    if (local_68.
        super__Vector_base<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_68.
        super__Vector_base<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar5 = false;
      bVar6 = false;
      psVar3 = local_68.
               super__Vector_base<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_80 = component;
      do {
        XmlDoc::rootNode((XmlDoc *)&local_f0);
        bVar1 = XmlNode::isMathmlElement
                          (local_f0.
                           super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           ,"math");
        if (bVar1) {
          XmlNode::convertToString_abi_cxx11_
                    (&local_c0,
                     local_f0.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          findAndReplaceCnUnitsNames(&local_f0,local_78,local_70);
          XmlNode::convertToString_abi_cxx11_
                    (&local_e0,
                     local_f0.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_e0._M_dataplus._M_p);
          bVar1 = true;
          bVar4 = true;
          if ((local_e0._M_string_length == local_c0._M_string_length) &&
             (bVar1 = bVar6, bVar4 = bVar5, local_e0._M_string_length != 0)) {
            iVar2 = bcmp(local_e0._M_dataplus._M_p,local_c0._M_dataplus._M_p,
                         local_e0._M_string_length);
            bVar1 = bVar5;
            if (iVar2 != 0) {
              bVar1 = true;
              bVar4 = true;
            }
          }
          bVar6 = bVar1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          bVar5 = bVar4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
        }
        if (local_f0.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_f0.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        psVar3 = psVar3 + 1;
      } while (psVar3 != local_68.
                         super__Vector_base<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
      if (bVar6) {
        Component::setMath((local_80->
                           super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr,&local_a0);
      }
    }
    std::
    vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
    ::~vector(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,
                      CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                               local_a0.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void findAndReplaceComponentCnUnitsNames(const ComponentPtr &component, const std::string &oldName, const std::string &newName)
{
    std::string mathContent = component->math();
    if (mathContent.empty()) {
        return;
    }
    bool contentModified = false;
    std::string newMathContent;
    std::vector<XmlDocPtr> mathDocs = multiRootXml(mathContent);
    for (const auto &doc : mathDocs) {
        auto rootNode = doc->rootNode();
        if (rootNode->isMathmlElement("math")) {
            auto originalMath = rootNode->convertToString();
            findAndReplaceCnUnitsNames(rootNode, oldName, newName);
            auto newMath = rootNode->convertToString();
            newMathContent += newMath;
            if (newMath != originalMath) {
                contentModified = true;
            }
        }
    }

    if (contentModified) {
        component->setMath(newMathContent);
    }
}